

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O2

size_t M_GetPos(Matrix *M,size_t RoC,size_t Entry)

{
  LASErrIdType LVar1;
  
  LVar1 = LASResult();
  if (LVar1 != LASOK) {
    return 0;
  }
  if (RoC == 0 || M->ElOrder != Rowws) {
    if (((M->ElOrder != Clmws || RoC == 0) || (M->ClmDim < RoC)) || (M->Len[RoC] <= Entry))
    goto LAB_001108e1;
  }
  else if (M->RowDim < RoC) {
LAB_001108e1:
    LASError(LASRangeErr,"M_GetPos",M->Name,(char *)0x0,(char *)0x0);
    return 0;
  }
  return M->El[RoC][Entry].Pos;
}

Assistant:

size_t M_GetPos(Matrix *M, size_t RoC, size_t Entry)
/* returns the position of a matrix entry */
{
    size_t Pos;

    if (LASResult() == LASOK)
        if ((M->ElOrder == Rowws && RoC > 0 && RoC <= M->RowDim) ||
            ((M->ElOrder == Clmws && RoC > 0 && RoC <= M->ClmDim) &&
            (Entry < M->Len[RoC]))) {
            Pos = M->El[RoC][Entry].Pos;
        } else {
            LASError(LASRangeErr, "M_GetPos", M->Name, NULL, NULL);
	    Pos = 0;
        }
    else
        Pos = 0;
    return(Pos);
}